

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O3

void __thiscall Vault::HttpClient::~HttpClient(HttpClient *this)

{
  *(undefined **)this = &std::locale::facet::typeinfo;
  if (*(code **)(this + 0xe8) != (code *)0x0) {
    (**(code **)(this + 0xe8))(this + 0xd8,this + 0xd8,3);
  }
  if (*(code **)(this + 200) != (code *)0x0) {
    (**(code **)(this + 200))(this + 0xb8,this + 0xb8,3);
  }
  Catch::clara::std::filesystem::__cxx11::path::~path((path *)(this + 0x90));
  if (*(HttpClient **)(this + 0x70) != this + 0x80) {
    operator_delete(*(HttpClient **)(this + 0x70),*(long *)(this + 0x80) + 1);
  }
  if (*(HttpClient **)(this + 0x50) != this + 0x60) {
    operator_delete(*(HttpClient **)(this + 0x50),*(long *)(this + 0x60) + 1);
  }
  if (*(HttpClient **)(this + 0x30) != this + 0x40) {
    operator_delete(*(HttpClient **)(this + 0x30),*(long *)(this + 0x40) + 1);
    return;
  }
  return;
}

Assistant:

virtual ~HttpClient() = default;